

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall fast_float::bigint::shl_limbs(bigint *this,size_t n)

{
  uint16_t *puVar1;
  ulong uVar2;
  ushort uVar3;
  long lVar4;
  
  uVar3 = (this->vec).length;
  uVar2 = uVar3 + n;
  if (uVar2 < 0x3f && (ulong)uVar3 != 0) {
    memmove((this->vec).data + n,this,(ulong)uVar3 << 3);
    for (lVar4 = 0; n * 8 - lVar4 != 0; lVar4 = lVar4 + 8) {
      *(undefined8 *)((long)(this->vec).data + lVar4) = 0;
    }
    puVar1 = &(this->vec).length;
    *puVar1 = *puVar1 + (short)n;
  }
  return uVar2 < 0x3f;
}

Assistant:

constexpr size_t len() const noexcept {
    return length;
  }